

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_flac_dr_callback__seek(void *pUserData,int offset,ma_dr_flac_seek_origin origin)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ma_seek_origin maSeekOrigin;
  ma_result result;
  ma_flac *pFlac;
  uint local_4;
  
  iVar1 = (**(code **)(in_RDI + 0x50))(*(undefined8 *)(in_RDI + 0x60),(long)in_ESI,in_EDX == 1);
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

static ma_bool32 ma_flac_dr_callback__seek(void* pUserData, int offset, ma_dr_flac_seek_origin origin)
{
    ma_flac* pFlac = (ma_flac*)pUserData;
    ma_result result;
    ma_seek_origin maSeekOrigin;

    MA_ASSERT(pFlac != NULL);

    maSeekOrigin = ma_seek_origin_start;
    if (origin == ma_dr_flac_seek_origin_current) {
        maSeekOrigin =  ma_seek_origin_current;
    }

    result = pFlac->onSeek(pFlac->pReadSeekTellUserData, offset, maSeekOrigin);
    if (result != MA_SUCCESS) {
        return MA_FALSE;
    }

    return MA_TRUE;
}